

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptorKeyAndModuleName
          (Generator *this,ServiceDescriptor *descriptor)

{
  long *plVar1;
  size_type *psVar2;
  string module_name;
  string name;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ModuleLevelServiceDescriptorName_abi_cxx11_(&local_58,this,descriptor);
  if (this->pure_python_workable_ == false) {
    std::operator+(&local_38,"_descriptor.ServiceDescriptor(full_name=\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)(descriptor + 8) + 0x20));
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
    psVar2 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2) {
      local_78.field_2._M_allocated_capacity = *psVar2;
      local_78.field_2._8_8_ = plVar1[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar2;
      local_78._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_78._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  io::Printer::Print<char[15],char[11],char[16],std::__cxx11::string>
            (this->printer_,"$descriptor_key$ = $descriptor_name$,\n",
             (char (*) [15])"descriptor_key",(char (*) [11])"DESCRIPTOR",(char (*) [16])0x3f67fa,
             &local_58);
  anon_unknown_0::ModuleName(&local_78,*(string **)this->file_);
  io::Printer::Print<char[12],std::__cxx11::string>
            (this->printer_,"__module__ = \'$module_name$\'\n",(char (*) [12])"module_name",
             &local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::PrintDescriptorKeyAndModuleName(
    const ServiceDescriptor& descriptor) const {
  std::string name = ModuleLevelServiceDescriptorName(descriptor);
  if (!pure_python_workable_) {
    name = "_descriptor.ServiceDescriptor(full_name='" +
           descriptor.full_name() + "')";
  }
  printer_->Print("$descriptor_key$ = $descriptor_name$,\n", "descriptor_key",
                  kDescriptorKey, "descriptor_name", name);
  std::string module_name = ModuleName(file_->name());
  printer_->Print("__module__ = '$module_name$'\n", "module_name", module_name);
}